

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O1

void Abc_NtkMultiCone_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vCone)

{
  uint uVar1;
  uint uVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  
  while( true ) {
    if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0x26a,"void Abc_NtkMultiCone_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    if ((*(uint *)&pNode->field_0x14 & 0x1f) != 7) break;
    Abc_NtkMultiCone_rec((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],vCone);
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]];
  }
  uVar1 = vCone->nSize;
  if (0 < (long)(int)uVar1) {
    lVar4 = 0;
    do {
      if ((Abc_Obj_t *)vCone->pArray[lVar4] == pNode) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while ((int)uVar1 != lVar4);
  }
  uVar2 = vCone->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vCone->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vCone->pArray,0x80);
      }
      vCone->pArray = ppvVar3;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar2 * 2;
      if (iVar5 <= (int)uVar2) goto LAB_002d8149;
      if (vCone->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vCone->pArray,(ulong)uVar2 << 4);
      }
      vCone->pArray = ppvVar3;
    }
    vCone->nCap = iVar5;
  }
LAB_002d8149:
  iVar5 = vCone->nSize;
  vCone->nSize = iVar5 + 1;
  vCone->pArray[iVar5] = pNode;
  return;
}

Assistant:

void Abc_NtkMultiCone_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vCone )
{
    assert( !Abc_ObjIsComplement(pNode) );
    if ( pNode->fMarkA || !Abc_ObjIsNode(pNode) )
    {
        Vec_PtrPushUnique( vCone, pNode );
        return;
    }
    Abc_NtkMultiCone_rec( Abc_ObjFanin(pNode,0), vCone );
    Abc_NtkMultiCone_rec( Abc_ObjFanin(pNode,1), vCone );
}